

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dioextra.c
# Opt level: O0

void do_pload(CHAR_DATA *ch,char *argument)

{
  string_view fmt;
  bool bVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  CHAR_DATA *pCVar5;
  DESCRIPTOR_DATA *pDVar6;
  size_t sVar7;
  FILE *pFVar8;
  CLogger *__return_storage_ptr__;
  char (*in_R9) [10];
  int returnCode;
  string buffer;
  CHAR_DATA *victim;
  char name [4608];
  DESCRIPTOR_DATA *d;
  CHAR_DATA *in_stack_00003388;
  char *in_stack_00005860;
  CHAR_DATA *in_stack_00005868;
  char *in_stack_ffffffffffffeaf8;
  string *this;
  char *in_stack_ffffffffffffeb00;
  CHAR_DATA *in_stack_ffffffffffffeb08;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffeb10;
  size_t *psVar9;
  CHAR_DATA *in_stack_ffffffffffffeb20;
  int *in_stack_ffffffffffffeb28;
  char **args;
  CLogger *this_00;
  undefined1 *puVar10;
  char *local_14b0;
  size_t local_14a8;
  string local_14a0 [32];
  undefined8 local_1480;
  int local_1454;
  char *local_1450;
  char local_1448 [8];
  undefined1 local_1440 [31];
  undefined1 in_stack_ffffffffffffebdf;
  char local_1418;
  format_args in_stack_ffffffffffffed60;
  string_view in_stack_ffffffffffffed70;
  undefined8 in_stack_fffffffffffffe20;
  undefined8 in_stack_fffffffffffffe28;
  char local_1c8;
  char cStack_1c7;
  char cStack_1c6;
  char cStack_1c5;
  char cStack_1c4;
  char cStack_1c3;
  char cStack_1c2;
  char cStack_1c1;
  undefined1 *local_1c0;
  char *local_1b8;
  char *local_1a8;
  char (*local_1a0) [10];
  char *local_198;
  char *local_190;
  size_t sStack_188;
  string *local_180;
  char *local_178;
  char **local_170;
  CLogger local_168 [64];
  char local_128 [16];
  char *local_118;
  char *local_108;
  char *local_100;
  char (*local_f8) [10];
  char *local_f0;
  char *local_e8;
  char acStack_e0 [8];
  undefined1 *local_d8;
  char *local_d0;
  char **local_c8;
  char *local_c0;
  char **local_b8;
  char *local_b0;
  char **local_a8;
  char **local_a0;
  char *local_98;
  undefined1 *local_88;
  undefined1 *local_80;
  undefined1 *local_78;
  undefined1 *local_70;
  char local_68 [8];
  undefined1 *local_60;
  char *local_58;
  char **local_50;
  char *local_48;
  CLogger *local_38;
  char *local_30;
  CLogger *local_28;
  char local_20 [8];
  char *local_18;
  CLogger *local_10;
  char *local_8;
  
  pcVar4 = one_argument(in_stack_ffffffffffffeb00,in_stack_ffffffffffffeaf8);
  if ((local_1418 == '\0') || (*pcVar4 == '\0')) {
    send_to_char((char *)in_stack_ffffffffffffeb10,in_stack_ffffffffffffeb08);
  }
  else {
    if ((local_1418 < 'a') || ('z' < local_1418)) {
      iVar2 = (int)local_1418;
    }
    else {
      iVar2 = local_1418 + -0x20;
    }
    local_1418 = (char)iVar2;
    pCVar5 = get_char_world((CHAR_DATA *)name._3608_8_,(char *)name._3600_8_);
    if (pCVar5 == (CHAR_DATA *)0x0) {
      pDVar6 = new_descriptor();
      bVar1 = load_char_obj((DESCRIPTOR_DATA *)in_stack_fffffffffffffe28,
                            (char *)in_stack_fffffffffffffe20);
      if (bVar1) {
        args = &local_1450;
        local_d0 = "cp {}{}{} {}pload.txt";
        local_c0 = "cp {}{}{} {}pload.txt";
        local_1450 = "cp {}{}{} {}pload.txt";
        local_c8 = args;
        local_b8 = args;
        pcVar4 = (char *)std::char_traits<char>::length((char_type *)0x64c0f6);
        args[1] = pcVar4;
        local_8 = local_d0;
        puVar10 = local_1440;
        local_e8 = local_1450;
        acStack_e0[0] = local_1448[0];
        acStack_e0[1] = local_1448[1];
        acStack_e0[2] = local_1448[2];
        acStack_e0[3] = local_1448[3];
        acStack_e0[4] = local_1448[4];
        acStack_e0[5] = local_1448[5];
        acStack_e0[6] = local_1448[6];
        acStack_e0[7] = local_1448[7];
        local_f0 = "../player";
        local_f8 = (char (*) [10])&stack0xffffffffffffebe8;
        local_100 = ".plr";
        local_108 = "../player";
        local_50 = &local_e8;
        local_118 = local_1450;
        __return_storage_ptr__ = local_168;
        local_d8 = puVar10;
        local_48 = local_118;
        ::fmt::v9::
        make_format_args<fmt::v9::basic_format_context<fmt::v9::appender,char>,char_const(&)[10],char(&)[4608],char_const(&)[5],char_const(&)[10]>
                  ((format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_char[10],_char[4608],_char[5],_char[10]>
                    *)__return_storage_ptr__,(v9 *)"../player",local_f8,(char (*) [4608])0x7f08bd,
                   (char (*) [5])"../player",in_R9);
        local_30 = local_128;
        local_20[0] = -0x34;
        local_20[1] = -0x34;
        local_20[2] = '\0';
        local_20[3] = '\0';
        local_20[4] = '\0';
        local_20[5] = '\0';
        local_20[6] = '\0';
        local_20[7] = '\0';
        local_128[0] = -0x34;
        local_128[1] = -0x34;
        local_128[2] = '\0';
        local_128[3] = '\0';
        local_128[4] = '\0';
        local_128[5] = '\0';
        local_128[6] = '\0';
        local_128[7] = '\0';
        this_00 = __return_storage_ptr__;
        local_38 = __return_storage_ptr__;
        local_28 = __return_storage_ptr__;
        local_18 = local_30;
        local_10 = __return_storage_ptr__;
        ::fmt::v9::vformat_abi_cxx11_(in_stack_ffffffffffffed70,in_stack_ffffffffffffed60);
        pcVar4 = (char *)std::__cxx11::string::c_str();
        iVar3 = system(pcVar4);
        local_1454 = iVar3;
        if (iVar3 != 0) {
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    (in_stack_ffffffffffffeb10,(char *)in_stack_ffffffffffffeb08);
          local_1480 = std::__cxx11::string::data();
          __return_storage_ptr__ = (CLogger *)&local_1454;
          fmt._M_str._0_4_ = iVar3;
          fmt._M_len = (size_t)puVar10;
          fmt._M_str._4_4_ = iVar2;
          CLogger::Warn<char*,int&>(this_00,fmt,args,in_stack_ffffffffffffeb28);
        }
        pDVar6->character->desc = (DESCRIPTOR_DATA *)0x0;
        pDVar6->character->next = char_list;
        char_list = pDVar6->character;
        pDVar6->outsize = 2000;
        pcVar4 = (char *)operator_new__((long)pDVar6->outsize);
        pDVar6->outbuf = pcVar4;
        pDVar6->connected = 0;
        reset_char(in_stack_ffffffffffffeb20);
        pCVar5 = pDVar6->character;
        pcVar4 = palloc_string(pcVar4);
        pDVar6->character->pcdata->host = pcVar4;
        interpret(in_stack_00005868,in_stack_00005860);
        local_170 = &local_14b0;
        local_178 = "{}/{}{}";
        local_b0 = "{}/{}{}";
        local_14b0 = "{}/{}{}";
        psVar9 = &local_14a8;
        local_a8 = local_170;
        sVar7 = std::char_traits<char>::length((char_type *)0x64c4ae);
        *psVar9 = sVar7;
        local_58 = local_178;
        local_180 = local_14a0;
        local_190 = local_14b0;
        sStack_188 = local_14a8;
        local_198 = "../player";
        local_1a0 = (char (*) [10])&stack0xffffffffffffebe8;
        local_1a8 = ".plr";
        local_a0 = &local_190;
        local_1b8 = local_14b0;
        local_98 = local_1b8;
        ::fmt::v9::
        make_format_args<fmt::v9::basic_format_context<fmt::v9::appender,char>,char_const(&)[10],char(&)[4608],char_const(&)[5]>
                  ((format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_char[10],_char[4608],_char[5]>
                    *)&stack0xfffffffffffffe08,(v9 *)"../player",local_1a0,(char (*) [4608])0x7f08bd
                   ,(char (*) [5])__return_storage_ptr__);
        local_80 = &stack0xfffffffffffffe38;
        local_88 = &stack0xfffffffffffffe08;
        local_68[0] = -0x34;
        local_68[1] = '\f';
        local_68[2] = '\0';
        local_68[3] = '\0';
        local_68[4] = '\0';
        local_68[5] = '\0';
        local_68[6] = '\0';
        local_68[7] = '\0';
        local_1c8 = -0x34;
        cStack_1c7 = '\f';
        cStack_1c6 = '\0';
        cStack_1c5 = '\0';
        cStack_1c4 = '\0';
        cStack_1c3 = '\0';
        cStack_1c2 = '\0';
        cStack_1c1 = '\0';
        local_78 = local_88;
        local_70 = local_88;
        local_60 = local_80;
        local_1c0 = local_88;
        ::fmt::v9::vformat_abi_cxx11_(in_stack_ffffffffffffed70,in_stack_ffffffffffffed60);
        pDVar6 = (DESCRIPTOR_DATA *)local_1440;
        this = local_14a0;
        std::__cxx11::string::operator=((string *)pDVar6,this);
        std::__cxx11::string::~string(this);
        pcVar4 = (char *)std::__cxx11::string::c_str();
        pFVar8 = fopen(pcVar4,"r");
        if (pFVar8 != (FILE *)0x0) {
          save_char_obj(in_stack_00003388);
          extract_char(pCVar5,(bool)in_stack_ffffffffffffebdf);
        }
        free_descriptor(pDVar6);
        std::__cxx11::string::~string((string *)local_1440);
      }
      else {
        send_to_char((char *)in_stack_ffffffffffffeb10,in_stack_ffffffffffffeb08);
      }
    }
    else {
      send_to_char((char *)in_stack_ffffffffffffeb10,in_stack_ffffffffffffeb08);
    }
  }
  return;
}

Assistant:

void do_pload(CHAR_DATA *ch, char *argument)
{
	DESCRIPTOR_DATA *d;
	char name[MAX_STRING_LENGTH];
	CHAR_DATA *victim;

	argument = one_argument(argument, name);

	if (name[0] == '\0' || argument[0] == '\0')
	{
		send_to_char("Syntax: pload <char> <command>\n\r", ch);
		return;
	}

	name[0] = UPPER(name[0]);

	if (get_char_world(ch, name) != nullptr)
	{
		send_to_char("That character is already online!\n\r", ch);
		return;
	}

	d = new_descriptor();

	if (!load_char_obj(d, name))
	{
		send_to_char("No such character exists.\n\r", ch);
		return;
	}

	auto buffer = fmt::format("cp {}{}{} {}pload.txt", RIFT_PLAYER_DIR, name, ".plr", RIFT_PLAYER_DIR);

	auto returnCode = system(buffer.c_str());
	if(returnCode != 0) // cp returns 0 on SUCCESS, 1 on ERROR. system returns -1 on ERROR
		RS.Logger.Warn("Command [{}] failed with exit code [{}]", buffer.data(), returnCode);

	d->character->desc = nullptr;
	d->character->next = char_list;

	char_list = d->character;

	d->outsize = 2000;
	d->outbuf = new char[d->outsize];
	d->connected = CON_PLAYING;

	reset_char(d->character);

	victim = d->character;

	d->character->pcdata->host = palloc_string("PLOAD");

	interpret(ch, argument);

	buffer = fmt::format("{}/{}{}", RIFT_PLAYER_DIR, name, ".plr");

	if (fopen(buffer.c_str(), "r") != nullptr)
	{
		save_char_obj(victim);
		extract_char(victim, true);
	}

	free_descriptor(d);
}